

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall TPZSkylMatrix<double>::Copy(TPZSkylMatrix<double> *this,TPZSkylMatrix<double> *A)

{
  double *pdVar1;
  long lVar2;
  int64_t iVar3;
  double **ppdVar4;
  long *in_RSI;
  long in_RDI;
  double *firstp;
  int64_t i;
  int64_t dimension;
  TPZVec<double> *in_stack_ffffffffffffffb8;
  TPZVec<double> *in_stack_ffffffffffffffc0;
  int64_t in_stack_ffffffffffffffd8;
  double *pdVar5;
  double *pdVar6;
  TPZVec<double_*> *in_stack_ffffffffffffffe0;
  long index;
  
  lVar2 = (**(code **)(*in_RSI + 0x60))();
  *(long *)(in_RDI + 0x10) = lVar2;
  *(long *)(in_RDI + 8) = lVar2;
  TPZVec<double_*>::NElements((TPZVec<double_*> *)(in_RSI + 4));
  TPZVec<double_*>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  TPZVec<double>::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  pdVar5 = (double *)0x0;
  iVar3 = TPZVec<double>::NElements((TPZVec<double> *)(in_RDI + 0x40));
  if (iVar3 != 0) {
    pdVar5 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0x40),0);
  }
  for (index = 0; index <= lVar2; index = index + 1) {
    pdVar6 = pdVar5;
    ppdVar4 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RSI + 4),index);
    pdVar1 = *ppdVar4;
    ppdVar4 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RSI + 4),0);
    pdVar5 = pdVar5 + ((long)pdVar1 - (long)*ppdVar4 >> 3);
    ppdVar4 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 0x20),index);
    *ppdVar4 = pdVar5;
    pdVar5 = pdVar6;
  }
  *(char *)(in_RDI + 0x18) = (char)in_RSI[3];
  *(undefined1 *)(in_RDI + 0x19) = *(undefined1 *)((long)in_RSI + 0x19);
  return;
}

Assistant:

void
TPZSkylMatrix<TVar>::Copy(const TPZSkylMatrix<TVar> &A )
{
    int64_t dimension = A.Dim();
    this->fRow = this->fCol = dimension;
    fElem.Resize(A.fElem.NElements());
    fStorage = A.fStorage;
    int64_t i;
    TVar *firstp = 0;
    if(fStorage.NElements()) firstp = &fStorage[0];
    for(i=0; i<=dimension; i++)
        fElem[i]=firstp+(A.fElem[i]-A.fElem[0]);
    this->fDecomposed  = A.fDecomposed;
    this->fDefPositive = A.fDefPositive;
    
}